

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::matrix2d>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *result)

{
  pointer *ppmVar1;
  pointer pmVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  matrix2d value;
  char c;
  string local_70;
  string local_50;
  
  pmVar2 = (result->
           super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>).
      _M_impl.super__Vector_impl_data._M_finish != pmVar2) {
    (result->
    super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>).
    _M_impl.super__Vector_impl_data._M_finish = pmVar2;
  }
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if (!bVar5) {
    return false;
  }
  local_70._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  local_70._M_string_length = 0;
  local_70.field_2._M_allocated_capacity = 0;
  local_70.field_2._8_8_ = 1.0;
  bVar5 = ParseMatrix(this,(matrix2d *)&local_70);
  if (bVar5) {
    iVar3._M_current =
         (result->
         super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (result->
        super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>::
      _M_realloc_insert<tinyusdz::value::matrix2d_const&>
                ((vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>> *)
                 result,iVar3,(matrix2d *)&local_70);
    }
    else {
      (iVar3._M_current)->m[1][0] = (double)local_70.field_2._M_allocated_capacity;
      (iVar3._M_current)->m[1][1] = (double)local_70.field_2._8_8_;
      (iVar3._M_current)->m[0][0] = (double)local_70._M_dataplus._M_p;
      (iVar3._M_current)->m[0][1] = (double)local_70._M_string_length;
      ppmVar1 = &(result->
                 super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppmVar1 = *ppmVar1 + 1;
    }
    do {
      pSVar4 = this->_sr;
      if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
      goto LAB_003b7db2;
      bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar5) {
        return false;
      }
      bVar5 = Char1(this,(char *)&local_50);
      if (!bVar5) {
        return false;
      }
      if ((char)local_50._M_dataplus._M_p == sep) {
        bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        bVar5 = LookChar1(this,(char *)&local_70);
        if (!bVar5) {
          return false;
        }
        iVar6 = 3;
        if ((char)local_70._M_dataplus._M_p != end_symbol) {
          goto LAB_003b7d10;
        }
      }
      else {
LAB_003b7d10:
        if ((char)local_50._M_dataplus._M_p != sep) {
          pSVar4 = this->_sr;
          if ((0 < (long)pSVar4->idx_) && (uVar7 = pSVar4->idx_ - 1, uVar7 <= pSVar4->length_)) {
            pSVar4->idx_ = uVar7;
          }
          goto LAB_003b7db2;
        }
        bVar5 = SkipWhitespaceAndNewline(this,true);
        if (!bVar5) {
          return false;
        }
        local_70._M_dataplus._M_p = (pointer)0x3ff0000000000000;
        local_70._M_string_length = 0;
        local_70.field_2._M_allocated_capacity = 0;
        local_70.field_2._8_8_ = 1.0;
        bVar5 = ParseMatrix(this,(matrix2d *)&local_70);
        iVar6 = 3;
        if (bVar5) {
          iVar3._M_current =
               (result->
               super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (result->
              super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>::
            _M_realloc_insert<tinyusdz::value::matrix2d_const&>
                      ((vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>
                        *)result,iVar3,(matrix2d *)&local_70);
          }
          else {
            (iVar3._M_current)->m[1][0] = (double)local_70.field_2._M_allocated_capacity;
            (iVar3._M_current)->m[1][1] = (double)local_70.field_2._8_8_;
            (iVar3._M_current)->m[0][0] = (double)local_70._M_dataplus._M_p;
            (iVar3._M_current)->m[0][1] = (double)local_70._M_string_length;
            ppmVar1 = &(result->
                       super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppmVar1 = *ppmVar1 + 1;
          }
          iVar6 = 0;
        }
      }
    } while (iVar6 == 0);
    if (iVar6 == 1) {
      return false;
    }
LAB_003b7db2:
    if ((result->
        super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>).
        _M_impl.super__Vector_impl_data._M_start !=
        (result->
        super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Empty array.\n","");
    PushError(this,&local_70);
    local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    _Var8._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return false;
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Not starting with the value of requested type.\n","");
    PushError(this,&local_50);
    _Var8._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return false;
    }
  }
  operator_delete(_Var8._M_p,local_50.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}